

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uLong cm_zlib_crc32_z(unsigned_long crc,uchar *buf,z_size_t len)

{
  z_crc_t zVar1;
  ulong uVar2;
  byte bVar3;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uLong uVar9;
  ulong uVar10;
  z_crc_t zVar11;
  z_crc_t zVar12;
  z_crc_t zVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (buf == (uchar *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar8 = crc & 0xffffffff ^ 0xffffffff;
    puVar4 = (ulong *)buf;
    if (0x2e < len) {
      for (; (len != 0 && (((ulong)buf & 7) != 0)); buf = buf + 1) {
        uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ (byte)*puVar4)] ^ uVar8 >> 8;
        puVar4 = (ulong *)((long)puVar4 + 1);
        len = len - 1;
      }
      zVar13 = 0;
      uVar2 = len / 0x28;
      zVar11 = 0;
      zVar12 = 0;
      uVar17 = 0;
      while( true ) {
        uVar2 = uVar2 - 1;
        if (uVar2 == 0) break;
        uVar10 = uVar8 ^ *puVar4;
        uVar18 = (ulong)zVar11 ^ puVar4[1];
        uVar14 = (ulong)zVar13 ^ puVar4[2];
        uVar15 = (ulong)zVar12 ^ puVar4[3];
        uVar6 = uVar17 ^ puVar4[4];
        uVar7 = crc_braid_table[0][(uint)uVar10 & 0xff];
        zVar11 = crc_braid_table[0][(uint)uVar18 & 0xff];
        zVar13 = crc_braid_table[0][(uint)uVar14 & 0xff];
        zVar12 = crc_braid_table[0][(uint)uVar15 & 0xff];
        uVar16 = crc_braid_table[0][(uint)uVar6 & 0xff];
        bVar3 = 8;
        lVar5 = 0;
        while( true ) {
          uVar17 = (ulong)uVar16;
          uVar8 = (ulong)uVar7;
          if (lVar5 == 0x1c00) break;
          uVar7 = uVar7 ^ *(uint *)(lVar5 + (ulong)((uint)(uVar10 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                            0x251490);
          zVar11 = zVar11 ^ *(uint *)(lVar5 + (ulong)((uint)(uVar18 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                              0x251490);
          zVar13 = zVar13 ^ *(uint *)(lVar5 + (ulong)((uint)(uVar14 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                              0x251490);
          zVar12 = zVar12 ^ *(uint *)(lVar5 + (ulong)((uint)(uVar15 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                              0x251490);
          uVar16 = uVar16 ^ *(uint *)(lVar5 + (ulong)((uint)(uVar6 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                              0x251490);
          lVar5 = lVar5 + 0x400;
          bVar3 = bVar3 + 8;
        }
        puVar4 = puVar4 + 5;
      }
      len = len % 0x28;
      zVar1 = crc_word(uVar8 ^ *puVar4);
      zVar11 = crc_word((ulong)zVar11 ^ puVar4[1] ^ (ulong)zVar1);
      zVar11 = crc_word((ulong)zVar13 ^ puVar4[2] ^ (ulong)zVar11);
      zVar11 = crc_word((ulong)zVar12 ^ puVar4[3] ^ (ulong)zVar11);
      zVar11 = crc_word(uVar17 ^ puVar4[4] ^ (ulong)zVar11);
      buf = (uchar *)(puVar4 + 5);
      uVar8 = (ulong)zVar11;
    }
    for (; 7 < len; len = len - 8) {
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ (byte)*(ulong *)buf)] ^ uVar8 >> 8;
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + 1))] ^ uVar8 >> 8;
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + 2))] ^ uVar8 >> 8;
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + 3))] ^ uVar8 >> 8;
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + 4))] ^ uVar8 >> 8;
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + 5))] ^ uVar8 >> 8;
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + 6))] ^ uVar8 >> 8;
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + 7))] ^ uVar8 >> 8;
      buf = (uchar *)((long)buf + 8);
    }
    for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
      uVar8 = (ulong)crc_table[(byte)((byte)uVar8 ^ *(byte *)((long)buf + uVar2))] ^ uVar8 >> 8;
    }
    uVar9 = uVar8 ^ 0xffffffff;
  }
  return uVar9;
}

Assistant:

unsigned long ZEXPORT crc32_z(unsigned long crc, const unsigned char FAR *buf,
                              z_size_t len) {
    /* Return initial CRC, if requested. */
    if (buf == Z_NULL) return 0;

#ifdef DYNAMIC_CRC_TABLE
    once(&made, make_crc_table);
#endif /* DYNAMIC_CRC_TABLE */

    /* Pre-condition the CRC */
    crc = (~crc) & 0xffffffff;

#ifdef W

    /* If provided enough bytes, do a braided CRC calculation. */
    if (len >= N * W + W - 1) {
        z_size_t blks;
        z_word_t const *words;
        unsigned endian;
        int k;

        /* Compute the CRC up to a z_word_t boundary. */
        while (len && ((z_size_t)buf & (W - 1)) != 0) {
            len--;
            crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        }

        /* Compute the CRC on as many N z_word_t blocks as are available. */
        blks = len / (N * W);
        len -= blks * N * W;
        words = (z_word_t const *)buf;

        /* Do endian check at execution time instead of compile time, since ARM
           processors can change the endianness at execution time. If the
           compiler knows what the endianness will be, it can optimize out the
           check and the unused branch. */
        endian = 1;
        if (*(unsigned char *)&endian) {
            /* Little endian. */

            z_crc_t crc0;
            z_word_t word0;
#if N > 1
            z_crc_t crc1;
            z_word_t word1;
#if N > 2
            z_crc_t crc2;
            z_word_t word2;
#if N > 3
            z_crc_t crc3;
            z_word_t word3;
#if N > 4
            z_crc_t crc4;
            z_word_t word4;
#if N > 5
            z_crc_t crc5;
            z_word_t word5;
#endif
#endif
#endif
#endif
#endif

            /* Initialize the CRC for each braid. */
            crc0 = crc;
#if N > 1
            crc1 = 0;
#if N > 2
            crc2 = 0;
#if N > 3
            crc3 = 0;
#if N > 4
            crc4 = 0;
#if N > 5
            crc5 = 0;
#endif
#endif
#endif
#endif
#endif

            /*
              Process the first blks-1 blocks, computing the CRCs on each braid
              independently.
             */
            while (--blks) {
                /* Load the word for each braid into registers. */
                word0 = crc0 ^ words[0];
#if N > 1
                word1 = crc1 ^ words[1];
#if N > 2
                word2 = crc2 ^ words[2];
#if N > 3
                word3 = crc3 ^ words[3];
#if N > 4
                word4 = crc4 ^ words[4];
#if N > 5
                word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
                words += N;

                /* Compute and update the CRC for each word. The loop should
                   get unrolled. */
                crc0 = crc_braid_table[0][word0 & 0xff];
#if N > 1
                crc1 = crc_braid_table[0][word1 & 0xff];
#if N > 2
                crc2 = crc_braid_table[0][word2 & 0xff];
#if N > 3
                crc3 = crc_braid_table[0][word3 & 0xff];
#if N > 4
                crc4 = crc_braid_table[0][word4 & 0xff];
#if N > 5
                crc5 = crc_braid_table[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
                for (k = 1; k < W; k++) {
                    crc0 ^= crc_braid_table[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                    crc1 ^= crc_braid_table[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                    crc2 ^= crc_braid_table[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                    crc3 ^= crc_braid_table[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                    crc4 ^= crc_braid_table[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                    crc5 ^= crc_braid_table[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
                }
            }

            /*
              Process the last block, combining the CRCs of the N braids at the
              same time.
             */
            crc = crc_word(crc0 ^ words[0]);
#if N > 1
            crc = crc_word(crc1 ^ words[1] ^ crc);
#if N > 2
            crc = crc_word(crc2 ^ words[2] ^ crc);
#if N > 3
            crc = crc_word(crc3 ^ words[3] ^ crc);
#if N > 4
            crc = crc_word(crc4 ^ words[4] ^ crc);
#if N > 5
            crc = crc_word(crc5 ^ words[5] ^ crc);
#endif
#endif
#endif
#endif
#endif
            words += N;
        }
        else {
            /* Big endian. */

            z_word_t crc0, word0, comb;
#if N > 1
            z_word_t crc1, word1;
#if N > 2
            z_word_t crc2, word2;
#if N > 3
            z_word_t crc3, word3;
#if N > 4
            z_word_t crc4, word4;
#if N > 5
            z_word_t crc5, word5;
#endif
#endif
#endif
#endif
#endif

            /* Initialize the CRC for each braid. */
            crc0 = byte_swap(crc);
#if N > 1
            crc1 = 0;
#if N > 2
            crc2 = 0;
#if N > 3
            crc3 = 0;
#if N > 4
            crc4 = 0;
#if N > 5
            crc5 = 0;
#endif
#endif
#endif
#endif
#endif

            /*
              Process the first blks-1 blocks, computing the CRCs on each braid
              independently.
             */
            while (--blks) {
                /* Load the word for each braid into registers. */
                word0 = crc0 ^ words[0];
#if N > 1
                word1 = crc1 ^ words[1];
#if N > 2
                word2 = crc2 ^ words[2];
#if N > 3
                word3 = crc3 ^ words[3];
#if N > 4
                word4 = crc4 ^ words[4];
#if N > 5
                word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
                words += N;

                /* Compute and update the CRC for each word. The loop should
                   get unrolled. */
                crc0 = crc_braid_big_table[0][word0 & 0xff];
#if N > 1
                crc1 = crc_braid_big_table[0][word1 & 0xff];
#if N > 2
                crc2 = crc_braid_big_table[0][word2 & 0xff];
#if N > 3
                crc3 = crc_braid_big_table[0][word3 & 0xff];
#if N > 4
                crc4 = crc_braid_big_table[0][word4 & 0xff];
#if N > 5
                crc5 = crc_braid_big_table[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
                for (k = 1; k < W; k++) {
                    crc0 ^= crc_braid_big_table[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                    crc1 ^= crc_braid_big_table[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                    crc2 ^= crc_braid_big_table[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                    crc3 ^= crc_braid_big_table[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                    crc4 ^= crc_braid_big_table[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                    crc5 ^= crc_braid_big_table[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
                }
            }

            /*
              Process the last block, combining the CRCs of the N braids at the
              same time.
             */
            comb = crc_word_big(crc0 ^ words[0]);
#if N > 1
            comb = crc_word_big(crc1 ^ words[1] ^ comb);
#if N > 2
            comb = crc_word_big(crc2 ^ words[2] ^ comb);
#if N > 3
            comb = crc_word_big(crc3 ^ words[3] ^ comb);
#if N > 4
            comb = crc_word_big(crc4 ^ words[4] ^ comb);
#if N > 5
            comb = crc_word_big(crc5 ^ words[5] ^ comb);
#endif
#endif
#endif
#endif
#endif
            words += N;
            crc = byte_swap(comb);
        }

        /*
          Update the pointer to the remaining bytes to process.
         */
        buf = (unsigned char const *)words;
    }

#endif /* W */

    /* Complete the computation of the CRC on any remaining bytes. */
    while (len >= 8) {
        len -= 8;
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
    }
    while (len) {
        len--;
        crc = (crc >> 8) ^ crc_table[(crc ^ *buf++) & 0xff];
    }

    /* Return the CRC, post-conditioned. */
    return crc ^ 0xffffffff;
}